

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.hpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
glu::
CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>::
getValue(CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>
         *this,RenderContext *context)

{
  set<int,_std::less<int>,_std::allocator<int>_> local_48;
  RenderContext *local_18;
  RenderContext *context_local;
  CachedValue<std::set<int,_std::less<int>,_std::allocator<int>_>,_glu::GetCompressedTextureFormats>
  *this_local;
  
  if ((this->m_isComputed & 1U) == 0) {
    local_18 = context;
    context_local = (RenderContext *)this;
    GetCompressedTextureFormats::operator()(&local_48,(GetCompressedTextureFormats *)this,context);
    std::set<int,_std::less<int>,_std::allocator<int>_>::operator=(&this->m_value,&local_48);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_48);
    this->m_isComputed = true;
  }
  return &this->m_value;
}

Assistant:

const T& getValue (const RenderContext& context) const
	{
		if (!m_isComputed)
		{
			m_value			= m_compute(context);
			m_isComputed	= true;
		}
		return m_value;
	}